

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

void __thiscall
cmCMakePresetsGraph::PrintTestPresetList(cmCMakePresetsGraph *this,PrintPrecedingNewline *newline)

{
  bool bVar1;
  TestPreset *pTVar2;
  mapped_type *local_70 [3];
  mapped_type *local_58;
  mapped_type *preset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  presets;
  PrintPrecedingNewline *newline_local;
  cmCMakePresetsGraph *this_local;
  
  presets.
  super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)newline;
  std::
  vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ::vector((vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
            *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->TestPresetOrder);
  p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->TestPresetOrder);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&p), bVar1) {
    preset = (mapped_type *)
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    local_58 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
               ::at(&this->TestPresets,(key_type *)preset);
    if (((((local_58->Unexpanded).super_Preset.Hidden & 1U) == 0) &&
        (bVar1 = std::optional::operator_cast_to_bool((optional *)&local_58->Expanded), bVar1)) &&
       (pTVar2 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(&local_58->Expanded),
       ((pTVar2->super_Preset).ConditionResult & 1U) != 0)) {
      local_70[0] = local_58;
      std::
      vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
      ::push_back((vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                   *)&__range1,(value_type *)local_70);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::
          vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
          ::empty((vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                   *)&__range1);
  if (!bVar1) {
    printPrecedingNewline
              ((PrintPrecedingNewline *)
               presets.
               super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<((ostream *)&std::cout,"Available test presets:\n\n");
    PrintPresets((vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                  *)&__range1);
  }
  std::
  vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ::~vector((vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
             *)&__range1);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintTestPresetList(
  PrintPrecedingNewline* newline) const
{
  std::vector<const cmCMakePresetsGraph::Preset*> presets;
  for (auto const& p : this->TestPresetOrder) {
    auto const& preset = this->TestPresets.at(p);
    if (!preset.Unexpanded.Hidden && preset.Expanded &&
        preset.Expanded->ConditionResult) {
      presets.push_back(
        static_cast<const cmCMakePresetsGraph::Preset*>(&preset.Unexpanded));
    }
  }

  if (!presets.empty()) {
    printPrecedingNewline(newline);
    std::cout << "Available test presets:\n\n";
    cmCMakePresetsGraph::PrintPresets(presets);
  }
}